

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditTextureFormatTests.cpp
# Opt level: O3

IterateResult __thiscall
dit::anon_unknown_0::DepthStencilFormatCase::iterate(DepthStencilFormatCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  PixelBufferAccess tmpAccess;
  ConstPixelBufferAccess inputAccess;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpMem;
  PixelBufferAccess tmpStencilAccess;
  PixelBufferAccess tmpDepthAccess;
  ConstPixelBufferAccess inputStencilAccess;
  ConstPixelBufferAccess inputDepthAccess;
  TextureFormat in_stack_fffffffffffffd58;
  int local_2a0;
  ConstPixelBufferAccess local_280;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  ConstPixelBufferAccess local_240;
  ConstPixelBufferAccess local_218;
  ConstPixelBufferAccess local_1f0;
  ConstPixelBufferAccess local_1c8;
  undefined1 local_1a0 [384];
  
  getInputAccess(in_stack_fffffffffffffd58);
  iVar2 = tcu::getPixelSize(local_280.m_format);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_258,(long)(iVar2 * local_280.m_size.m_data[0]),(allocator_type *)local_1a0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&stack0xfffffffffffffd58,&local_280.m_format,
             local_280.m_size.m_data[0],1,1,
             local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::getEffectiveDepthStencilAccess(&local_1c8,&local_280,MODE_DEPTH);
  tcu::getEffectiveDepthStencilAccess(&local_1f0,&local_280,MODE_STENCIL);
  tcu::getEffectiveDepthStencilAccess
            ((PixelBufferAccess *)&local_218,(PixelBufferAccess *)&stack0xfffffffffffffd58,
             MODE_DEPTH);
  tcu::getEffectiveDepthStencilAccess
            ((PixelBufferAccess *)&local_240,(PixelBufferAccess *)&stack0xfffffffffffffd58,
             MODE_STENCIL);
  tcu::TestContext::setTestResult
            ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  TextureFormatCase::verifyInfoQueries(&this->super_TextureFormatCase);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_1c8);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_1f0);
  TextureFormatCase::verifyGetPixDepth(&this->super_TextureFormatCase,&local_1c8,&local_280);
  TextureFormatCase::verifyGetPixStencil(&this->super_TextureFormatCase,&local_1f0,&local_280);
  local_1a0._0_8_ = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Copying both depth and stencil with getPixel() -> setPixel()",0x3c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  copyPixels(&local_1c8,(PixelBufferAccess *)&local_218);
  copyPixels(&local_1f0,(PixelBufferAccess *)&local_240);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_218);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_240);
  local_1a0._0_8_ = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Copying both depth and stencil with getPix{Depth,Stencil}() -> setPix{Depth,Stencil}()"
             ,0x56);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  copyGetSetDepth(&local_1c8,(PixelBufferAccess *)&local_218);
  copyGetSetStencil(&local_1f0,(PixelBufferAccess *)&local_240);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_218);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_240);
  local_1a0._0_8_ = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Verifying that clearing depth component with clearDepth() doesn\'t affect stencil",
             0x50);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  tcu::copy((EVP_PKEY_CTX *)&stack0xfffffffffffffd58,(EVP_PKEY_CTX *)&local_280);
  tcu::clearDepth((PixelBufferAccess *)&stack0xfffffffffffffd58,0.0);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_240);
  local_1a0._0_8_ = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Verifying that clearing stencil component with clearStencil() doesn\'t affect depth",
             0x52);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  tcu::copy((EVP_PKEY_CTX *)&stack0xfffffffffffffd58,(EVP_PKEY_CTX *)&local_280);
  tcu::clearStencil((PixelBufferAccess *)&stack0xfffffffffffffd58,0);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_218);
  local_1a0._0_8_ = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Verifying that clearing depth component with setPixDepth() doesn\'t affect stencil",
             0x51);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  tcu::copy((EVP_PKEY_CTX *)&stack0xfffffffffffffd58,(EVP_PKEY_CTX *)&local_280);
  if (0 < local_2a0) {
    iVar2 = 0;
    do {
      tcu::PixelBufferAccess::setPixDepth
                ((PixelBufferAccess *)&stack0xfffffffffffffd58,0.0,iVar2,0,0);
      iVar2 = iVar2 + 1;
    } while (iVar2 < local_2a0);
  }
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_240);
  local_1a0._0_8_ = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Verifying that clearing stencil component with setPixStencil() doesn\'t affect depth",
             0x53);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  tcu::copy((EVP_PKEY_CTX *)&stack0xfffffffffffffd58,(EVP_PKEY_CTX *)&local_280);
  if (0 < local_2a0) {
    iVar2 = 0;
    do {
      tcu::PixelBufferAccess::setPixStencil
                ((PixelBufferAccess *)&stack0xfffffffffffffd58,0,iVar2,0,0);
      iVar2 = iVar2 + 1;
    } while (iVar2 < local_2a0);
  }
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&local_218);
  if (local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const ConstPixelBufferAccess	inputAccess			= getInputAccess(m_format);
		vector<deUint8>					tmpMem				(getPixelSize(inputAccess.getFormat())*inputAccess.getWidth());
		const PixelBufferAccess			tmpAccess			(inputAccess.getFormat(), inputAccess.getWidth(), 1, 1, &tmpMem[0]);
		const ConstPixelBufferAccess	inputDepthAccess	= getEffectiveDepthStencilAccess(inputAccess, tcu::Sampler::MODE_DEPTH);
		const ConstPixelBufferAccess	inputStencilAccess	= getEffectiveDepthStencilAccess(inputAccess, tcu::Sampler::MODE_STENCIL);
		const PixelBufferAccess			tmpDepthAccess		= getEffectiveDepthStencilAccess(tmpAccess, tcu::Sampler::MODE_DEPTH);
		const PixelBufferAccess			tmpStencilAccess	= getEffectiveDepthStencilAccess(tmpAccess, tcu::Sampler::MODE_STENCIL);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		verifyInfoQueries();

		verifyRead(inputDepthAccess);
		verifyRead(inputStencilAccess);

		verifyGetPixDepth(inputDepthAccess, inputAccess);
		verifyGetPixStencil(inputStencilAccess, inputAccess);

		m_testCtx.getLog() << TestLog::Message << "Copying both depth and stencil with getPixel() -> setPixel()" << TestLog::EndMessage;
		copyPixels(inputDepthAccess, tmpDepthAccess);
		copyPixels(inputStencilAccess, tmpStencilAccess);
		verifyRead(tmpDepthAccess);
		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Copying both depth and stencil with getPix{Depth,Stencil}() -> setPix{Depth,Stencil}()" << TestLog::EndMessage;
		copyGetSetDepth(inputDepthAccess, tmpDepthAccess);
		copyGetSetStencil(inputStencilAccess, tmpStencilAccess);
		verifyRead(tmpDepthAccess);
		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing depth component with clearDepth() doesn't affect stencil" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);
		tcu::clearDepth(tmpAccess, 0.0f);
		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing stencil component with clearStencil() doesn't affect depth" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);
		tcu::clearStencil(tmpAccess, 0);
		verifyRead(tmpDepthAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing depth component with setPixDepth() doesn't affect stencil" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);

		for (int ndx = 0; ndx < tmpAccess.getWidth(); ndx++)
			tmpAccess.setPixDepth(0.0f, ndx, 0, 0);

		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing stencil component with setPixStencil() doesn't affect depth" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);

		for (int ndx = 0; ndx < tmpAccess.getWidth(); ndx++)
			tmpAccess.setPixStencil(0, ndx, 0, 0);

		verifyRead(tmpDepthAccess);

		return STOP;
	}